

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandProcessFinished
          (BuildSystemFrontendDelegate *this,Command *param_1,ProcessHandle handle,
          ProcessResult *result)

{
  void *pvVar1;
  pointer __ptr;
  pointer pvVar2;
  iterator I;
  unique_lock<std::mutex> lock;
  ProcessHandle handle_local;
  
  pvVar1 = this->impl;
  handle_local = handle;
  std::unique_lock<std::mutex>::unique_lock(&lock,(mutex_type *)((long)pvVar1 + 0x50));
  I = llvm::
      DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::find((DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)((long)pvVar1 + 0x38),&handle_local.id);
  pvVar2 = I.Ptr;
  if (pvVar2 != (pointer)((ulong)*(uint *)((long)pvVar1 + 0x48) * 0x20 +
                         *(long *)((long)pvVar1 + 0x38))) {
    __ptr = (pvVar2->
            super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>).
            second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
    fwrite(__ptr,(long)(pvVar2->
                       super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ).second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)__ptr,1,_stdout);
    fflush(_stdout);
    llvm::
    DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::erase((DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)((long)pvVar1 + 0x38),I);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void BuildSystemFrontendDelegate::
commandProcessFinished(Command*, ProcessHandle handle,
                       const ProcessResult& result) {
  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
  std::unique_lock<std::mutex> lock(impl->processOutputBuffersMutex);

  // If there was an output buffer, flush it.
  auto it = impl->processOutputBuffers.find(handle.id);
  if (it == impl->processOutputBuffers.end())
    return;

  fwrite(it->second.data(), it->second.size(), 1, stdout);
  fflush(stdout);

  impl->processOutputBuffers.erase(it);  
}